

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_RepeatedFieldMoveCtorOnArena_Test::TestBody
          (ArenaTest_RepeatedFieldMoveCtorOnArena_Test *this)

{
  int iVar1;
  void *ptr;
  SooRep *this_00;
  int *piVar2;
  SooRep *this_01;
  Nonnull<const_char_*> pcVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  pointer pcVar4;
  char *pcVar5;
  Arena arena;
  AssertHelper local_e0;
  undefined1 local_d8 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_d0;
  Message local_c8;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_c0;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  ptr = Arena::Allocate((Arena *)&local_b8,0x10);
  local_d8 = (undefined1  [8])&local_b8;
  this_00 = &Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
             Construct<google::protobuf::Arena*>(ptr,(Arena **)local_d8)->soo_rep_;
  RepeatedField<int>::Add((RepeatedField<int> *)this_00,1);
  RepeatedField<int>::Add((RepeatedField<int> *)this_00,2);
  local_c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       protobuf::internal::SooRep::size
                 (this_00,(undefined1  [16])
                          ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                          (undefined1  [16])0x0);
  local_e0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"original->size()","2",(int *)&local_c8,(int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_d0._M_head_impl == (LogMessageData *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = *(char **)local_d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x1c2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,&local_c8);
LAB_0051d65b:
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)CONCAT44(local_c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_c8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_c8.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
LAB_0051d675:
    if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )local_d0._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    goto LAB_0051d738;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_d0;
  }
  else {
    if (local_d0._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._M_head_impl);
    }
    iVar1 = protobuf::internal::SooRep::size
                      (this_00,(undefined1  [16])
                               ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar1 < 1) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)iVar1,"index < size()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x32c,pcVar3);
      goto LAB_0051daa2;
    }
    piVar2 = RepeatedField<int>::elements
                       ((RepeatedField<int> *)this_00,
                        (undefined1  [16])
                        ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    local_d8._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_c8,"original->Get(0)","1",piVar2,(int *)local_d8);
    if (local_c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_d8);
      if (local_c0._M_head_impl == (LogMessageData *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (pointer)((local_c0._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1c3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
    }
    else {
      if (local_c0._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_c0._M_head_impl);
      }
      iVar1 = protobuf::internal::SooRep::size
                        (this_00,(undefined1  [16])
                                 ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
      if (iVar1 < 2) {
        pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)iVar1,"index < size()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x32c,pcVar3);
        goto LAB_0051daa2;
      }
      piVar2 = RepeatedField<int>::elements
                         ((RepeatedField<int> *)this_00,
                          (undefined1  [16])
                          ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                          (undefined1  [16])0x0);
      local_d8._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_c8,"original->Get(1)","2",piVar2 + 1,(int *)local_d8);
      if (local_c8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ != (internal)0x0) {
        if (local_c0._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c0._M_head_impl);
        }
        this_01 = (SooRep *)Arena::Allocate((Arena *)&local_b8,0x10);
        RepeatedField<int>::RepeatedField
                  ((RepeatedField<int> *)this_01,(Arena *)&local_b8,(RepeatedField<int> *)this_00);
        local_c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             protobuf::internal::SooRep::size
                       (this_01,(undefined1  [16])
                                ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
        local_e0.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_d8,"moved->size()","2",(int *)&local_c8,(int *)&local_e0);
        if (local_d8[0] == (internal)0x0) {
          testing::Message::Message(&local_c8);
          if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )local_d0._M_head_impl ==
              (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = *(char **)local_d0._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1c9,pcVar5);
          testing::internal::AssertHelper::operator=(&local_e0,&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if ((long *)CONCAT44(local_c8.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (int)local_c8.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_c8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (int)local_c8.ss_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl) + 8))();
          }
        }
        if (local_d0._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_d0._M_head_impl);
        }
        iVar1 = protobuf::internal::SooRep::size
                          (this_01,(undefined1  [16])
                                   ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                   (undefined1  [16])0x0);
        if (iVar1 < 1) {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (0,(long)iVar1,"index < size()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x32c,pcVar3);
LAB_0051daa2:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_d8);
        }
        piVar2 = RepeatedField<int>::elements
                           ((RepeatedField<int> *)this_01,
                            (undefined1  [16])
                            ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                            (undefined1  [16])0x0);
        local_d8._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_c8,"moved->Get(0)","1",piVar2,(int *)local_d8);
        if (local_c8.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_d8);
          if (local_c0._M_head_impl == (LogMessageData *)0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (char *)((local_c0._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1ca,pcVar5);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if (local_d8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_d8 + 8))();
          }
        }
        if (local_c0._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c0._M_head_impl);
        }
        iVar1 = protobuf::internal::SooRep::size
                          (this_01,(undefined1  [16])
                                   ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                   (undefined1  [16])0x0);
        if (iVar1 < 2) {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (1,(long)iVar1,"index < size()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x32c,pcVar3);
          goto LAB_0051daa2;
        }
        piVar2 = RepeatedField<int>::elements
                           ((RepeatedField<int> *)this_01,
                            (undefined1  [16])
                            ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                            (undefined1  [16])0x0);
        local_d8._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_c8,"moved->Get(1)","2",piVar2 + 1,(int *)local_d8);
        if (local_c8.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_d8);
          if (local_c0._M_head_impl == (LogMessageData *)0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (char *)((local_c0._M_head_impl)->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1cb,pcVar5);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if (local_d8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_d8 + 8))();
          }
        }
        if (local_c0._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_c0._M_head_impl);
        }
        local_c8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             protobuf::internal::SooRep::size
                       (this_00,(undefined1  [16])
                                ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
        local_e0.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_d8,"original->size()","0",(int *)&local_c8,(int *)&local_e0);
        if (local_d8[0] == (internal)0x0) {
          testing::Message::Message(&local_c8);
          if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )local_d0._M_head_impl ==
              (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )0x0) {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = *(char **)local_d0._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                     ,0x1cf,pcVar5);
          testing::internal::AssertHelper::operator=(&local_e0,&local_c8);
          goto LAB_0051d65b;
        }
        goto LAB_0051d675;
      }
      testing::Message::Message((Message *)local_d8);
      if (local_c0._M_head_impl == (LogMessageData *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (pointer)((local_c0._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x1c4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    if (local_c0._M_head_impl == (LogMessageData *)0x0) goto LAB_0051d738;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_c0;
    local_d0._M_head_impl = local_c0._M_head_impl;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_d0._M_head_impl);
LAB_0051d738:
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(ArenaTest, RepeatedFieldMoveCtorOnArena) {
  Arena arena;

  auto* original = Arena::Create<RepeatedField<int32_t>>(&arena);
  original->Add(1);
  original->Add(2);
  ASSERT_EQ(original->size(), 2);
  ASSERT_EQ(original->Get(0), 1);
  ASSERT_EQ(original->Get(1), 2);

  auto* moved =
      Arena::Create<RepeatedField<int32_t>>(&arena, std::move(*original));

  EXPECT_EQ(moved->size(), 2);
  EXPECT_EQ(moved->Get(0), 1);
  EXPECT_EQ(moved->Get(1), 2);

  // Status after move is unspecified and must not be assumed. It's merely
  // checking current implementation specifics for protobuf internal.
  EXPECT_EQ(original->size(), 0);
}